

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collimator.cpp
# Opt level: O2

void __thiscall imrt::Collimator::printAxisValues(Collimator *this)

{
  pointer pdVar1;
  ostream *poVar2;
  int i;
  ulong uVar3;
  
  std::operator<<((ostream *)&std::cout,"x:");
  for (uVar3 = 0;
      pdVar1 = (this->xcoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(this->xcoord).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pdVar1 >> 3);
      uVar3 = uVar3 + 1) {
    poVar2 = std::ostream::_M_insert<double>(pdVar1[uVar3]);
    std::operator<<(poVar2,",");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::operator<<((ostream *)&std::cout,"y:");
  for (uVar3 = 0;
      pdVar1 = (this->ycoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(this->ycoord).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pdVar1 >> 3);
      uVar3 = uVar3 + 1) {
    poVar2 = std::ostream::_M_insert<double>(pdVar1[uVar3]);
    std::operator<<(poVar2,",");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void Collimator::printAxisValues() {
    cout << "x:";
    for (int i=0;i<xcoord.size(); i++ )
      cout << xcoord[i] << ",";
    cout << endl;
    cout << "y:";
    for (int i=0;i<ycoord.size(); i++ )
      cout << ycoord[i] << ",";
    cout << endl;
  }